

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseCallbackQuery_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_58);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"id",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->id);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"from",&local_59);
    psVar1 = &local_38;
    parseUser_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->from);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"message",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->message);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"inline_message_id",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->inlineMessageId);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"chat_instance",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->chatInstance);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"game_short_name",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->gameShortName);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"data",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->data);
    std::__cxx11::string::~string((string *)&local_58);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseCallbackQuery(const CallbackQuery::Ptr& object) const {
    if (!object){
        return "";
    }

    string result;
    result += '{';
    appendToJson(result, "id", object->id);
    appendToJson(result, "from", parseUser(object->from));
    appendToJson(result, "message", parseMessage(object->message));
    appendToJson(result, "inline_message_id", object->inlineMessageId);
    appendToJson(result, "chat_instance", object->chatInstance);
    appendToJson(result, "game_short_name", object->gameShortName);
    appendToJson(result, "data", object->data);
    removeLastComma(result);
    result += '}';
    return result;
}